

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SscWriterGeneric.cpp
# Opt level: O0

StepStatus __thiscall
adios2::core::engine::ssc::SscWriterGeneric::BeginStep
          (SscWriterGeneric *this,StepMode mode,float timeoutSeconds,bool writerLocked)

{
  bool bVar1;
  uint8_t *puVar2;
  size_type sVar3;
  ompi_request_t **ppoVar4;
  byte in_DL;
  thread *in_RDI;
  vector<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>,_std::allocator<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>
  *unaff_retaddr;
  size_t in_stack_000000a8;
  Buffer *in_stack_000000b0;
  thread *__new_size;
  
  *(byte *)&in_RDI[0x2b]._M_id._M_thread = in_DL & 1;
  __new_size = in_RDI;
  if (((in_RDI[0x10]._M_id._M_thread & 1) != 0) && (bVar1 = std::thread::joinable(in_RDI), bVar1)) {
    std::thread::join();
  }
  in_RDI[10]._M_id._M_thread = in_RDI[10]._M_id._M_thread + 1;
  if (((in_RDI[10]._M_id._M_thread == 0) || ((in_RDI[0x2b]._M_id._M_thread & 1) == 0)) ||
     ((in_RDI[0x2b]._M_id._M_thread & 0x100) == 0)) {
    Buffer::resize(in_stack_000000b0,in_stack_000000a8);
    puVar2 = Buffer::operator[]((Buffer *)(in_RDI + 7),0);
    *puVar2 = '\0';
    std::
    vector<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>,_std::allocator<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>
    ::clear((vector<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>,_std::allocator<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>
             *)0x1d16ae);
    std::
    vector<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>,_std::allocator<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>
    ::resize(unaff_retaddr,(size_type)__new_size);
    std::
    vector<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>,_std::allocator<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>
    ::clear((vector<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>,_std::allocator<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>
             *)0x1d16d7);
    std::
    vector<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>,_std::allocator<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>
    ::resize(unaff_retaddr,(size_type)__new_size);
  }
  if (1 < (long)in_RDI[10]._M_id._M_thread) {
    if (((in_RDI[0x2b]._M_id._M_thread & 1) == 0) || ((in_RDI[0x2b]._M_id._M_thread & 0x100) == 0))
    {
      MPI_Win_free(in_RDI + 0x19);
    }
    else {
      sVar3 = std::vector<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>::size
                        ((vector<ompi_request_t_*,_std::allocator<ompi_request_t_*>_> *)
                         (in_RDI + 0x21));
      ppoVar4 = std::vector<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>::data
                          ((vector<ompi_request_t_*,_std::allocator<ompi_request_t_*>_> *)0x1d173d);
      MPI_Waitall(sVar3 & 0xffffffff,ppoVar4,0);
      std::vector<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>::clear
                ((vector<ompi_request_t_*,_std::allocator<ompi_request_t_*>_> *)0x1d175e);
    }
  }
  return OK;
}

Assistant:

StepStatus SscWriterGeneric::BeginStep(const StepMode mode, const float timeoutSeconds,
                                       const bool writerLocked)
{

    m_WriterDefinitionsLocked = writerLocked;

    if (m_Threading && m_EndStepThread.joinable())
    {
        m_EndStepThread.join();
    }

    ++m_CurrentStep;

    if (m_CurrentStep == 0 || m_WriterDefinitionsLocked == false ||
        m_ReaderSelectionsLocked == false)
    {
        m_Buffer.resize(1);
        m_Buffer[0] = 0;
        m_GlobalWritePattern.clear();
        m_GlobalWritePattern.resize(m_StreamSize);
        m_GlobalReadPattern.clear();
        m_GlobalReadPattern.resize(m_StreamSize);
    }

    if (m_CurrentStep > 1)
    {
        if (m_WriterDefinitionsLocked && m_ReaderSelectionsLocked)
        {
            MPI_Waitall(static_cast<int>(m_MpiRequests.size()), m_MpiRequests.data(),
                        MPI_STATUSES_IGNORE);
            m_MpiRequests.clear();
        }
        else
        {
            MPI_Win_free(&m_MpiWin);
        }
    }

    return StepStatus::OK;
}